

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDither(Image *image,int rBpp,int gBpp,int bBpp,int aBpp)

{
  Color CVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  Image image_00;
  byte bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Color CVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uchar uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  Color *colors;
  void *pvVar21;
  undefined4 uVar22;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  uchar local_78;
  uchar local_74;
  uchar local_70;
  uchar local_6c;
  uchar local_68;
  uchar local_64;
  uchar local_60;
  uchar local_5c;
  uchar local_58;
  uchar local_54;
  uchar local_50;
  int local_4c;
  int local_48;
  int x;
  int y;
  unsigned_short aPixel;
  unsigned_short bPixel;
  unsigned_short gPixel;
  unsigned_short rPixel;
  int bError;
  int gError;
  int rError;
  Color newPixel;
  Color oldPixel;
  Color *pixels;
  int aBpp_local;
  int bBpp_local;
  int gBpp_local;
  int rBpp_local;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (image->format < 0xb) {
      if (rBpp + gBpp + bBpp + aBpp < 0x11) {
        uVar22 = (undefined4)((ulong)image->data >> 0x20);
        uVar6 = image->width;
        uVar7 = image->height;
        uVar8 = image->mipmaps;
        uVar9 = image->format;
        image_00.height = uVar9;
        image_00.width = uVar8;
        image_00.data._4_4_ = uVar7;
        image_00.data._0_4_ = uVar6;
        image_00.mipmaps = in_stack_ffffffffffffff80;
        image_00.format = in_stack_ffffffffffffff84;
        colors = LoadImageColors(image_00);
        free(image->data);
        if ((image->format != 4) && (image->format != 7)) {
          TraceLog(4,"IMAGE: Format is already 16bpp or lower, dithering could have no effect");
        }
        if (((rBpp == 5) && (gBpp == 6)) && ((bBpp == 5 && (aBpp == 0)))) {
          image->format = 3;
        }
        else if ((((rBpp == 5) && (gBpp == 5)) && (bBpp == 5)) && (aBpp == 1)) {
          image->format = 5;
        }
        else if (((rBpp == 4) && (gBpp == 4)) && ((bBpp == 4 && (aBpp == 4)))) {
          image->format = 6;
        }
        else {
          image->format = 0;
          TraceLog(4,"IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)",
                   (ulong)(uint)(rBpp + gBpp + bBpp + aBpp),(ulong)(uint)rBpp,(ulong)(uint)gBpp,
                   (ulong)(uint)bBpp,CONCAT44(uVar22,aBpp));
        }
        pvVar21 = malloc((long)(image->width * image->height) << 1);
        image->data = pvVar21;
        for (local_48 = 0; local_48 < image->height; local_48 = local_48 + 1) {
          for (local_4c = 0; local_4c < image->width; local_4c = local_4c + 1) {
            CVar1 = colors[local_48 * image->width + local_4c];
            uVar15 = (int)((uint)CVar1 & 0xff) >> (8U - (char)rBpp & 0x1f);
            bVar5 = (byte)uVar15;
            rError._1_1_ = CVar1.g;
            cVar2 = (char)gBpp;
            uVar16 = (int)(uint)rError._1_1_ >> (8U - cVar2 & 0x1f);
            bVar11 = (byte)uVar16;
            CVar10.g = bVar11;
            CVar10.r = bVar5;
            rError._2_1_ = CVar1.b;
            cVar3 = (char)bBpp;
            uVar17 = (int)(uint)rError._2_1_ >> (8U - cVar3 & 0x1f);
            bVar12 = (byte)uVar17;
            CVar10.b = bVar12;
            bVar4 = (byte)aBpp;
            bVar13 = (byte)((int)((uint)CVar1 >> 0x18) >> (8 - bVar4 & 0x1f));
            CVar10.a = bVar13;
            iVar18 = ((uint)CVar1 & 0xff) - ((uVar15 & 0xff) << (8U - (char)rBpp & 0x1f));
            iVar19 = (uint)rError._1_1_ - ((uVar16 & 0xff) << (8U - cVar2 & 0x1f));
            iVar20 = (uint)rError._2_1_ - ((uVar17 & 0xff) << (8U - cVar3 & 0x1f));
            colors[local_48 * image->width + local_4c] = CVar10;
            if (local_4c < image->width + -1) {
              if ((int)((uint)colors[local_48 * image->width + local_4c + 1].r +
                       (int)(((float)iVar18 * 7.0) / 16.0)) < 0xff) {
                local_50 = colors[local_48 * image->width + local_4c + 1].r +
                           (char)(int)(((float)iVar18 * 7.0) / 16.0);
              }
              else {
                local_50 = 0xff;
              }
              colors[local_48 * image->width + local_4c + 1].r = local_50;
              if ((int)((uint)colors[local_48 * image->width + local_4c + 1].g +
                       (int)(((float)iVar19 * 7.0) / 16.0)) < 0xff) {
                local_54 = colors[local_48 * image->width + local_4c + 1].g +
                           (char)(int)(((float)iVar19 * 7.0) / 16.0);
              }
              else {
                local_54 = 0xff;
              }
              colors[local_48 * image->width + local_4c + 1].g = local_54;
              if ((int)((uint)colors[local_48 * image->width + local_4c + 1].b +
                       (int)(((float)iVar20 * 7.0) / 16.0)) < 0xff) {
                local_58 = colors[local_48 * image->width + local_4c + 1].b +
                           (char)(int)(((float)iVar20 * 7.0) / 16.0);
              }
              else {
                local_58 = 0xff;
              }
              colors[local_48 * image->width + local_4c + 1].b = local_58;
            }
            if ((0 < local_4c) && (local_48 < image->height + -1)) {
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + -1].r +
                       (int)(((float)iVar18 * 3.0) / 16.0)) < 0xff) {
                local_5c = colors[(local_48 + 1) * image->width + local_4c + -1].r +
                           (char)(int)(((float)iVar18 * 3.0) / 16.0);
              }
              else {
                local_5c = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + -1].r = local_5c;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + -1].g +
                       (int)(((float)iVar19 * 3.0) / 16.0)) < 0xff) {
                local_60 = colors[(local_48 + 1) * image->width + local_4c + -1].g +
                           (char)(int)(((float)iVar19 * 3.0) / 16.0);
              }
              else {
                local_60 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + -1].g = local_60;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + -1].b +
                       (int)(((float)iVar20 * 3.0) / 16.0)) < 0xff) {
                local_64 = colors[(local_48 + 1) * image->width + local_4c + -1].b +
                           (char)(int)(((float)iVar20 * 3.0) / 16.0);
              }
              else {
                local_64 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + -1].b = local_64;
            }
            if (local_48 < image->height + -1) {
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c].r +
                       (int)(((float)iVar18 * 5.0) / 16.0)) < 0xff) {
                local_68 = colors[(local_48 + 1) * image->width + local_4c].r +
                           (char)(int)(((float)iVar18 * 5.0) / 16.0);
              }
              else {
                local_68 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c].r = local_68;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c].g +
                       (int)(((float)iVar19 * 5.0) / 16.0)) < 0xff) {
                local_6c = colors[(local_48 + 1) * image->width + local_4c].g +
                           (char)(int)(((float)iVar19 * 5.0) / 16.0);
              }
              else {
                local_6c = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c].g = local_6c;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c].b +
                       (int)(((float)iVar20 * 5.0) / 16.0)) < 0xff) {
                local_70 = colors[(local_48 + 1) * image->width + local_4c].b +
                           (char)(int)(((float)iVar20 * 5.0) / 16.0);
              }
              else {
                local_70 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c].b = local_70;
            }
            if ((local_4c < image->width + -1) && (local_48 < image->height + -1)) {
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + 1].r +
                       (int)(((float)iVar18 * 1.0) / 16.0)) < 0xff) {
                local_74 = colors[(local_48 + 1) * image->width + local_4c + 1].r +
                           (char)(int)(((float)iVar18 * 1.0) / 16.0);
              }
              else {
                local_74 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + 1].r = local_74;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + 1].g +
                       (int)(((float)iVar19 * 1.0) / 16.0)) < 0xff) {
                local_78 = colors[(local_48 + 1) * image->width + local_4c + 1].g +
                           (char)(int)(((float)iVar19 * 1.0) / 16.0);
              }
              else {
                local_78 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + 1].g = local_78;
              if ((int)((uint)colors[(local_48 + 1) * image->width + local_4c + 1].b +
                       (int)(((float)iVar20 * 1.0) / 16.0)) < 0xff) {
                uVar14 = colors[(local_48 + 1) * image->width + local_4c + 1].b +
                         (char)(int)(((float)iVar20 * 1.0) / 16.0);
              }
              else {
                uVar14 = 0xff;
              }
              colors[(local_48 + 1) * image->width + local_4c + 1].b = uVar14;
            }
            *(ushort *)((long)image->data + (long)(local_48 * image->width + local_4c) * 2) =
                 (ushort)bVar5 << (cVar2 + cVar3 + bVar4 & 0x1f) |
                 (ushort)bVar11 << (cVar3 + bVar4 & 0x1f) | (ushort)bVar12 << (bVar4 & 0x1f) |
                 (ushort)bVar13;
          }
        }
        UnloadImageColors(colors);
      }
      else {
        TraceLog(4,"IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported",
                 (ulong)(uint)(rBpp + gBpp + bBpp + aBpp));
      }
    }
    else {
      TraceLog(4,"IMAGE: Compressed data formats can not be dithered");
    }
  }
  return;
}

Assistant:

void ImageDither(Image *image, int rBpp, int gBpp, int bBpp, int aBpp)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Compressed data formats can not be dithered");
        return;
    }

    if ((rBpp + gBpp + bBpp + aBpp) > 16)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (rBpp+gBpp+bBpp+aBpp));
    }
    else
    {
        Color *pixels = LoadImageColors(*image);

        RL_FREE(image->data);      // free old image data

        if ((image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8))
        {
            TRACELOG(LOG_WARNING, "IMAGE: Format is already 16bpp or lower, dithering could have no effect");
        }

        // Define new image format, check if desired bpp match internal known format
        if ((rBpp == 5) && (gBpp == 6) && (bBpp == 5) && (aBpp == 0)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
        else if ((rBpp == 5) && (gBpp == 5) && (bBpp == 5) && (aBpp == 1)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
        else if ((rBpp == 4) && (gBpp == 4) && (bBpp == 4) && (aBpp == 4)) image->format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
        else
        {
            image->format = 0;
            TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)", (rBpp+gBpp+bBpp+aBpp), rBpp, gBpp, bBpp, aBpp);
        }

        // NOTE: We will store the dithered data as unsigned short (16bpp)
        image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

        Color oldPixel = WHITE;
        Color newPixel = WHITE;

        int rError, gError, bError;
        unsigned short rPixel, gPixel, bPixel, aPixel;   // Used for 16bit pixel composition

        #define MIN(a,b) (((a)<(b))?(a):(b))

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                oldPixel = pixels[y*image->width + x];

                // NOTE: New pixel obtained by bits truncate, it would be better to round values (check ImageFormat())
                newPixel.r = oldPixel.r >> (8 - rBpp);     // R bits
                newPixel.g = oldPixel.g >> (8 - gBpp);     // G bits
                newPixel.b = oldPixel.b >> (8 - bBpp);     // B bits
                newPixel.a = oldPixel.a >> (8 - aBpp);     // A bits (not used on dithering)

                // NOTE: Error must be computed between new and old pixel but using same number of bits!
                // We want to know how much color precision we have lost...
                rError = (int)oldPixel.r - (int)(newPixel.r << (8 - rBpp));
                gError = (int)oldPixel.g - (int)(newPixel.g << (8 - gBpp));
                bError = (int)oldPixel.b - (int)(newPixel.b << (8 - bBpp));

                pixels[y*image->width + x] = newPixel;

                // NOTE: Some cases are out of the array and should be ignored
                if (x < (image->width - 1))
                {
                    pixels[y*image->width + x+1].r = MIN((int)pixels[y*image->width + x+1].r + (int)((float)rError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].g = MIN((int)pixels[y*image->width + x+1].g + (int)((float)gError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].b = MIN((int)pixels[y*image->width + x+1].b + (int)((float)bError*7.0f/16), 0xff);
                }

                if ((x > 0) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x-1].r = MIN((int)pixels[(y+1)*image->width + x-1].r + (int)((float)rError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].g = MIN((int)pixels[(y+1)*image->width + x-1].g + (int)((float)gError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].b = MIN((int)pixels[(y+1)*image->width + x-1].b + (int)((float)bError*3.0f/16), 0xff);
                }

                if (y < (image->height - 1))
                {
                    pixels[(y+1)*image->width + x].r = MIN((int)pixels[(y+1)*image->width + x].r + (int)((float)rError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].g = MIN((int)pixels[(y+1)*image->width + x].g + (int)((float)gError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].b = MIN((int)pixels[(y+1)*image->width + x].b + (int)((float)bError*5.0f/16), 0xff);
                }

                if ((x < (image->width - 1)) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x+1].r = MIN((int)pixels[(y+1)*image->width + x+1].r + (int)((float)rError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].g = MIN((int)pixels[(y+1)*image->width + x+1].g + (int)((float)gError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].b = MIN((int)pixels[(y+1)*image->width + x+1].b + (int)((float)bError*1.0f/16), 0xff);
                }

                rPixel = (unsigned short)newPixel.r;
                gPixel = (unsigned short)newPixel.g;
                bPixel = (unsigned short)newPixel.b;
                aPixel = (unsigned short)newPixel.a;

                ((unsigned short *)image->data)[y*image->width + x] = (rPixel << (gBpp + bBpp + aBpp)) | (gPixel << (bBpp + aBpp)) | (bPixel << aBpp) | aPixel;
            }
        }

        UnloadImageColors(pixels);
    }
}